

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe37At7(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)*buf >> 7) | ((ulong)*(uint5 *)(buf + 1) & 0xfffffffff) << 1;
}

Assistant:

std::uint64_t readFlUIntLe37At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 1;
    res |= (buf[0] >> 7);
    res &= UINT64_C(0x1fffffffff);
    return res;
}